

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection.cpp
# Opt level: O2

void duckdb::ColumnDataCopyStruct
               (ColumnDataMetaData *meta_data,UnifiedVectorFormat *source_data,Vector *source,
               idx_t offset,idx_t copy_count)

{
  ColumnDataCollectionSegment *this;
  column_data_copy_function_t p_Var1;
  child_list_t<LogicalType> *pcVar2;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  reference pvVar3;
  VectorMetaData *pVVar4;
  reference pvVar5;
  pointer this_01;
  type pVVar6;
  ulong __n;
  ColumnDataMetaData local_a8;
  UnifiedVectorFormat child_data;
  
  this = meta_data->segment;
  TemplatedColumnDataCopy<duckdb::StructValueCopy>(meta_data,source_data,source,offset,copy_count);
  pcVar2 = StructType::GetChildTypes_abi_cxx11_(&source->type);
  this_00 = StructVector::GetEntries(source);
  for (__n = 0; __n < (ulong)(((long)(pcVar2->
                                     super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                     ).
                                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pcVar2->
                                    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                    ).
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x38);
      __n = __n + 1) {
    pvVar3 = vector<duckdb::ColumnDataCopyFunction,_true>::get<true>
                       (&meta_data->copy_function->child_functions,__n);
    pVVar4 = ColumnDataMetaData::GetVectorMetaData(meta_data);
    local_a8.vector_data_index =
         ColumnDataCollectionSegment::GetChildIndex(this,(pVVar4->child_index).index,__n);
    local_a8.segment = meta_data->segment;
    local_a8.state = meta_data->state;
    local_a8.chunk_data = meta_data->chunk_data;
    local_a8.child_list_size = 0xffffffffffffffff;
    local_a8.copy_function = pvVar3;
    UnifiedVectorFormat::UnifiedVectorFormat(&child_data);
    pvVar5 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
             ::get<true>(this_00,__n);
    this_01 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                        (pvVar5);
    Vector::ToUnifiedFormat(this_01,copy_count,&child_data);
    p_Var1 = pvVar3->function;
    pvVar5 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
             ::get<true>(this_00,__n);
    pVVar6 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       (pvVar5);
    (*p_Var1)(&local_a8,&child_data,pVVar6,offset,copy_count);
    UnifiedVectorFormat::~UnifiedVectorFormat(&child_data);
  }
  return;
}

Assistant:

void ColumnDataCopyStruct(ColumnDataMetaData &meta_data, const UnifiedVectorFormat &source_data, Vector &source,
                          idx_t offset, idx_t copy_count) {
	auto &segment = meta_data.segment;

	// copy the NULL values for the main struct vector
	TemplatedColumnDataCopy<StructValueCopy>(meta_data, source_data, source, offset, copy_count);

	auto &child_types = StructType::GetChildTypes(source.GetType());
	// now copy all the child vectors
	D_ASSERT(meta_data.GetVectorMetaData().child_index.IsValid());
	auto &child_vectors = StructVector::GetEntries(source);
	for (idx_t child_idx = 0; child_idx < child_types.size(); child_idx++) {
		auto &child_function = meta_data.copy_function.child_functions[child_idx];
		auto child_index = segment.GetChildIndex(meta_data.GetVectorMetaData().child_index, child_idx);
		ColumnDataMetaData child_meta_data(child_function, meta_data, child_index);

		UnifiedVectorFormat child_data;
		child_vectors[child_idx]->ToUnifiedFormat(copy_count, child_data);

		child_function.function(child_meta_data, child_data, *child_vectors[child_idx], offset, copy_count);
	}
}